

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

void test_cancel(void)

{
  cio_error cVar1;
  cio_eventloop loop;
  cio_eventloop local_4f0;
  
  epoll_ctl_fake.custom_fake = epoll_ctl_save;
  epoll_wait_fake.custom_fake = notify_single_fd;
  memset(&local_4f0,0,0x4e8);
  cVar1 = cio_eventloop_init(&local_4f0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x198,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x199,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_cancel(&local_4f0);
  cio_eventloop_run(&local_4f0);
  cio_eventloop_destroy(&local_4f0);
  UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x19e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cancel(void)
{
	epoll_ctl_fake.custom_fake = epoll_ctl_save;
	epoll_wait_fake.custom_fake = notify_single_fd;

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	cio_eventloop_cancel(&loop);
	cio_eventloop_run(&loop);
	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}